

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxs.cpp
# Opt level: O3

PAL_ERROR PAL_Enter(PAL_Boundary boundary)

{
  PAL_ERROR PVar1;
  CPalThread *pCVar2;
  CPalThread *local_28;
  
  if (!PAL_InitializeChakraCoreCalled) goto LAB_00331788;
  pCVar2 = (CPalThread *)pthread_getspecific(CorUnix::thObjKey);
  if ((pCVar2 == (CPalThread *)0x0) &&
     (pCVar2 = CreateCurrentThreadData(), pCVar2 == (CPalThread *)0x0)) {
    if (boundary != PAL_BoundaryTop) {
      fprintf(_stderr,"] %s %s:%d","PAL_Enter",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/init/sxs.cpp"
              ,0x41);
      fprintf(_stderr,
              "Expression: PAL_BoundaryTop == boundary, Description: How are we entering a PAL thread for the first time not from the top? (boundary=%u)"
              ,boundary);
    }
    PVar1 = AllocatePalThread(&local_28);
    if (PVar1 == 0) goto LAB_0033171e;
    if ((PAL_InitializeChakraCoreCalled & 1U) == 0) goto LAB_00331788;
  }
  else {
    if (pCVar2->m_fInPal == true) {
      if (PAL_InitializeChakraCoreCalled == false) goto LAB_00331788;
    }
    else {
      pCVar2->m_fInPal = true;
    }
LAB_0033171e:
    PVar1 = 0;
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return PVar1;
  }
LAB_00331788:
  abort();
}

Assistant:

PAL_ERROR
PALAPI
PAL_Enter(PAL_Boundary boundary)
{
    ENTRY_EXTERNAL("PAL_Enter(boundary=%u)\n", boundary);

    PAL_ERROR palError = ERROR_SUCCESS;
    CPalThread *pThread = InternalGetCurrentThread();
    if (pThread != NULL)
    {
        palError = pThread->Enter(boundary);
    }
    else
    {
        // If this assert fires, we'll have to pipe this information so that
        // CPalThread's RunPostCreateInitializers call to SEHEnable
        // can know what direction.
        _ASSERT_MSG(PAL_BoundaryTop == boundary, "How are we entering a PAL "
            "thread for the first time not from the top? (boundary=%u)", boundary);

        palError = AllocatePalThread(&pThread);
        if (NO_ERROR != palError)
        {
            ERROR("Unable to allocate pal thread: error %d\n", palError);
        }
    }

    LOGEXIT("PAL_Enter returns %d\n", palError);
    return palError;
}